

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base32Encoding.cpp
# Opt level: O3

size_t axl::enc::Base32Encoding::encode(String *string,void *p,size_t size,uint_t flags)

{
  byte bVar1;
  BufHdr *pBVar2;
  char *__s;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  size_t length;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  bool bVar14;
  ulong uVar6;
  
  if (size == 0) {
    pBVar2 = (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (pBVar2 != (BufHdr *)0x0) {
      if ((pBVar2->super_RefCount).m_refCount == 1) {
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
             (C *)(pBVar2 + 1);
        *(undefined1 *)&pBVar2[1].super_RefCount._vptr_RefCount = 0;
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
      }
      else {
        sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                  (&string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      }
    }
    return 0;
  }
  lVar7 = (ulong)(0x3333333333333333 < size * 0x6666666666666668) + (size * 8) / 5;
  uVar6 = 0;
  if ((flags & 1) == 0) {
    uVar6 = (ulong)(-(int)lVar7 & 7);
  }
  length = uVar6 + lVar7;
  if ((flags & 2) == 0) {
    __s = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer(string,length,false)
    ;
    if (__s == (C *)0x0) {
      return 0xffffffffffffffff;
    }
    pcVar5 = __s + length;
    if (0 < (long)size) {
      pbVar13 = (byte *)(size + (long)p);
      uVar9 = 0;
      lVar7 = 0;
      do {
        lVar4 = lVar7;
        bVar1 = *p;
        uVar9 = uVar9 << 8 | (uint)bVar1;
        lVar11 = 0;
        do {
          pcVar3 = __s;
          *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"
                    [uVar9 >> ((char)lVar4 + (char)lVar11 + 3U & 0x1f) & 0x1f];
          __s = pcVar3 + 1;
          lVar7 = lVar4 + lVar11;
          lVar11 = lVar11 + -5;
        } while (4 < lVar7 + 3U);
        p = (void *)((long)p + 1);
        lVar7 = lVar4 + lVar11 + 8;
      } while (p < pbVar13);
      if (lVar4 + lVar11 != -8) {
        *__s = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"
               [(uint)bVar1 << (-((char)lVar11 + (char)lVar4) - 3U & 0x1f) & 0x1f];
        __s = pcVar3 + 2;
      }
    }
  }
  else {
    length = ((length >> 6) + length) - (ulong)((length & 0xfc0) == 0);
    __s = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer(string,length,false)
    ;
    if (__s == (C *)0x0) {
      return 0xffffffffffffffff;
    }
    pcVar5 = __s + length;
    if (0 < (long)size) {
      pbVar13 = (byte *)(size + (long)p);
      uVar8 = 0;
      uVar9 = 0;
      uVar6 = 0;
      do {
        bVar1 = *p;
        uVar9 = uVar9 << 8 | (uint)bVar1;
        uVar12 = uVar6 + 8;
        iVar10 = (int)uVar6 + 3;
        do {
          pcVar3 = __s;
          bVar14 = (uVar8 & 0x3f) == 0;
          if (bVar14) {
            *pcVar3 = '\n';
          }
          uVar12 = uVar12 - 5;
          __s = pcVar3 + bVar14 + 1;
          pcVar3[bVar14] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar9 >> ((byte)iVar10 & 0x1f) & 0x1f]
          ;
          iVar10 = iVar10 + -5;
          uVar8 = uVar8 + 1;
        } while (4 < uVar12);
        p = (void *)((long)p + 1);
        uVar6 = uVar12;
      } while (p < pbVar13);
      if (uVar12 != 0) {
        pcVar3[(ulong)bVar14 + 1] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(uint)bVar1 << (-(char)iVar10 & 0x1fU) & 0x1f];
        __s = pcVar3 + (ulong)bVar14 + 2;
      }
    }
  }
  if (__s < pcVar5) {
    memset(__s,0x3d,(long)pcVar5 - (long)__s);
  }
  return length;
}

Assistant:

size_t
Base32Encoding::encode(
	sl::String* string,
	const void* p,
	size_t size,
	uint_t flags
) {
	if (!size) {
		string->clear();
		return 0;
	}

	size_t bitCount = size * 8;
	size_t length = bitCount / 5;
	if (bitCount % 5)
		length++;

	if (!(flags & Base32EncodingFlag_NoPadding))
		length += 7 - ((length - 1) & 7);

	if (flags & Base32EncodingFlag_Multiline) {
		size_t lineCount = length / 64;
		if (lineCount & 0x3f)
			lineCount++;

		length += lineCount - 1;
	}

	char* dst = string->createBuffer(length);
	if (!dst)
		return -1;

	if (flags & Base32EncodingFlag_Multiline)
		encodeImpl<GetBase32Char, InsertNl>(dst, length, (uchar_t*)p, size);
	else
		encodeImpl<GetBase32Char, InsertNoNl>(dst, length, (uchar_t*)p, size);

	return length;
}